

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::ResultBuilder::captureExpectedException(ResultBuilder *this,string *expectedMessage)

{
  undefined1 local_48 [24];
  _Alloc_hider _Stack_30;
  pointer local_28;
  
  if (expectedMessage->_M_string_length == 0) {
    local_48._8_4_ = 0;
    local_48._0_8_ = &PTR__AllOf_0016b6e8;
    local_48._16_8_ = (pointer)0x0;
    _Stack_30._M_p = (pointer)0x0;
    local_28 = (pointer)0x0;
    captureExpectedException
              (this,(Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_48);
    Matchers::Impl::Generic::
    AllOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~AllOf
              ((AllOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_48);
  }
  else {
    Matchers::Impl::StdString::Equals::Equals((Equals *)local_48,expectedMessage,Yes);
    captureExpectedException
              (this,(Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_48);
    Matchers::Impl::StdString::Equals::~Equals((Equals *)local_48);
  }
  return;
}

Assistant:

void ResultBuilder::captureExpectedException( std::string const& expectedMessage ) {
        if( expectedMessage.empty() )
            captureExpectedException( Matchers::Impl::Generic::AllOf<std::string>() );
        else
            captureExpectedException( Matchers::Equals( expectedMessage ) );
    }